

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void vkt::shaderexecutor::
     ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  Vector<tcu::Interval,_4> *ival_00;
  int local_24;
  int ndx;
  ostream *os_local;
  IVal *ival_local;
  FloatFormat *fmt_local;
  
  std::operator<<(os,"(");
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    if (0 < local_24) {
      std::operator<<(os,", ");
    }
    ival_00 = tcu::Matrix<tcu::Interval,_4,_2>::operator[](ival,local_24);
    printIVal<tcu::Vector<float,4>>(fmt,ival_00,os);
  }
  std::operator<<(os,")");
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}